

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O0

CURLcode pop3_perform_apop(Curl_easy *data,connectdata *conn)

{
  uchar *puVar1;
  uint uVar2;
  MD5_context *context;
  size_t sVar3;
  char local_88 [8];
  char secret [33];
  byte local_58 [8];
  uchar digest [16];
  MD5_context *ctxt;
  size_t i;
  pop3_conn *pop3c;
  CURLcode result;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  if ((data->state).aptr.user == (char *)0x0) {
    pop3_state(data,POP3_STOP);
    data_local._4_4_ = CURLE_OK;
  }
  else {
    context = Curl_MD5_init(&Curl_DIGEST_MD5);
    if (context == (MD5_context *)0x0) {
      data_local._4_4_ = CURLE_OUT_OF_MEMORY;
    }
    else {
      puVar1 = (uchar *)(conn->proto).imapc.dyn.toobig;
      sVar3 = strlen((char *)(conn->proto).imapc.dyn.toobig);
      uVar2 = curlx_uztoui(sVar3);
      Curl_MD5_update(context,puVar1,uVar2);
      puVar1 = (uchar *)conn->passwd;
      sVar3 = strlen(conn->passwd);
      uVar2 = curlx_uztoui(sVar3);
      Curl_MD5_update(context,puVar1,uVar2);
      Curl_MD5_final(context,local_58);
      for (ctxt = (MD5_context *)0x0; ctxt < (MD5_context *)0x10;
          ctxt = (MD5_context *)((long)&ctxt->md5_hash + 1)) {
        curl_msnprintf(local_88 + (long)ctxt * 2,3,"%02x",(ulong)local_58[(long)ctxt]);
      }
      data_local._4_4_ = Curl_pp_sendf(data,&(conn->proto).ftpc.pp,"APOP %s %s",conn->user,local_88)
      ;
      if (data_local._4_4_ == CURLE_OK) {
        pop3_state(data,POP3_APOP);
      }
    }
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode pop3_perform_apop(struct Curl_easy *data,
                                  struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  struct pop3_conn *pop3c = &conn->proto.pop3c;
  size_t i;
  struct MD5_context *ctxt;
  unsigned char digest[MD5_DIGEST_LEN];
  char secret[2 * MD5_DIGEST_LEN + 1];

  /* Check we have a username and password to authenticate with and end the
     connect phase if we do not */
  if(!data->state.aptr.user) {
    pop3_state(data, POP3_STOP);

    return result;
  }

  /* Create the digest */
  ctxt = Curl_MD5_init(&Curl_DIGEST_MD5);
  if(!ctxt)
    return CURLE_OUT_OF_MEMORY;

  Curl_MD5_update(ctxt, (const unsigned char *) pop3c->apoptimestamp,
                  curlx_uztoui(strlen(pop3c->apoptimestamp)));

  Curl_MD5_update(ctxt, (const unsigned char *) conn->passwd,
                  curlx_uztoui(strlen(conn->passwd)));

  /* Finalise the digest */
  Curl_MD5_final(ctxt, digest);

  /* Convert the calculated 16 octet digest into a 32 byte hex string */
  for(i = 0; i < MD5_DIGEST_LEN; i++)
    msnprintf(&secret[2 * i], 3, "%02x", digest[i]);

  result = Curl_pp_sendf(data, &pop3c->pp, "APOP %s %s", conn->user, secret);

  if(!result)
    pop3_state(data, POP3_APOP);

  return result;
}